

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVFilterCols64_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x32,int dx)

{
  uint uVar1;
  long lVar2;
  uint16_t b_1;
  uint16_t a_1;
  int xf_1;
  int64_t xi_1;
  uint16_t b;
  uint16_t a;
  int xf;
  int64_t xi;
  int j;
  uint16_t *dst;
  uint16_t *src;
  int64_t x;
  int dx_local;
  int x32_local;
  int dst_width_local;
  uint8_t *src_uv_local;
  uint8_t *dst_uv_local;
  
  x = (int64_t)x32;
  dst = (uint16_t *)dst_uv;
  for (j = 0; lVar2 = x >> 0x10, uVar1 = (uint)(x >> 9), j < dst_width + -1; j = j + 2) {
    uVar1 = uVar1 & 0x7f;
    *dst = (ushort)(((int)(((int)(uint)*(ushort *)(src_uv + lVar2 * 2) >> 8) * (uVar1 ^ 0x7f) +
                          ((int)(uint)*(ushort *)(src_uv + lVar2 * 2 + 2) >> 8) * uVar1) >> 7) << 8)
           | (ushort)((int)((*(ushort *)(src_uv + lVar2 * 2) & 0xff) * (uVar1 ^ 0x7f) +
                           (*(ushort *)(src_uv + lVar2 * 2 + 2) & 0xff) * uVar1) >> 7);
    lVar2 = dx + x;
    uVar1 = (uint)(lVar2 >> 9) & 0x7f;
    dst[1] = (ushort)(((int)(((int)(uint)*(ushort *)(src_uv + (lVar2 >> 0x10) * 2) >> 8) *
                             (uVar1 ^ 0x7f) +
                            ((int)(uint)*(ushort *)(src_uv + (lVar2 >> 0x10) * 2 + 2) >> 8) * uVar1)
                      >> 7) << 8) |
             (ushort)((int)((*(ushort *)(src_uv + (lVar2 >> 0x10) * 2) & 0xff) * (uVar1 ^ 0x7f) +
                           (*(ushort *)(src_uv + (lVar2 >> 0x10) * 2 + 2) & 0xff) * uVar1) >> 7);
    x = dx + lVar2;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    uVar1 = uVar1 & 0x7f;
    *dst = (ushort)(((int)(((int)(uint)*(ushort *)(src_uv + lVar2 * 2) >> 8) * (uVar1 ^ 0x7f) +
                          ((int)(uint)*(ushort *)(src_uv + lVar2 * 2 + 2) >> 8) * uVar1) >> 7) << 8)
           | (ushort)((int)((*(ushort *)(src_uv + lVar2 * 2) & 0xff) * (uVar1 ^ 0x7f) +
                           (*(ushort *)(src_uv + lVar2 * 2 + 2) & 0xff) * uVar1) >> 7);
  }
  return;
}

Assistant:

void ScaleUVFilterCols64_C(uint8_t* dst_uv,
                           const uint8_t* src_uv,
                           int dst_width,
                           int x32,
                           int dx) {
  int64_t x = (int64_t)(x32);
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}